

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

VkBufferUsageFlags vkt::memory::anon_unknown_0::usageToBufferUsageFlags(Usage usage)

{
  Usage UVar1;
  uint local_10;
  VkBufferUsageFlags flags;
  Usage usage_local;
  
  UVar1 = operator&(usage,USAGE_TRANSFER_SRC);
  local_10 = (uint)(UVar1 != 0);
  UVar1 = operator&(usage,USAGE_TRANSFER_DST);
  if (UVar1 != 0) {
    local_10 = local_10 | 2;
  }
  UVar1 = operator&(usage,USAGE_INDEX_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x40;
  }
  UVar1 = operator&(usage,USAGE_VERTEX_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x80;
  }
  UVar1 = operator&(usage,USAGE_INDIRECT_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x100;
  }
  UVar1 = operator&(usage,USAGE_UNIFORM_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x10;
  }
  UVar1 = operator&(usage,USAGE_STORAGE_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 0x20;
  }
  UVar1 = operator&(usage,USAGE_UNIFORM_TEXEL_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 4;
  }
  UVar1 = operator&(usage,USAGE_STORAGE_TEXEL_BUFFER);
  if (UVar1 != 0) {
    local_10 = local_10 | 8;
  }
  return local_10;
}

Assistant:

vk::VkBufferUsageFlags usageToBufferUsageFlags (Usage usage)
{
	vk::VkBufferUsageFlags flags = 0;

	if (usage & USAGE_TRANSFER_SRC)
		flags |= vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT;

	if (usage & USAGE_TRANSFER_DST)
		flags |= vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT;

	if (usage & USAGE_INDEX_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT;

	if (usage & USAGE_VERTEX_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT;

	if (usage & USAGE_INDIRECT_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT;

	if (usage & USAGE_UNIFORM_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT;

	if (usage & USAGE_STORAGE_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;

	if (usage & USAGE_UNIFORM_TEXEL_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT;

	if (usage & USAGE_STORAGE_TEXEL_BUFFER)
		flags |= vk::VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT;

	return flags;
}